

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O3

dynhds_entry * Curl_dynhds_get(dynhds *dynhds,char *name,size_t namelen)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = dynhds->hds_len;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      if (dynhds->hds[uVar3]->namelen == namelen) {
        iVar1 = curl_strnequal(dynhds->hds[uVar3]->name,name,namelen);
        if (iVar1 != 0) {
          return dynhds->hds[uVar3];
        }
        uVar2 = dynhds->hds_len;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  return (dynhds_entry *)0x0;
}

Assistant:

struct dynhds_entry *Curl_dynhds_get(struct dynhds *dynhds, const char *name,
                                     size_t namelen)
{
  size_t i;
  for(i = 0; i < dynhds->hds_len; ++i) {
    if(dynhds->hds[i]->namelen == namelen &&
       strncasecompare(dynhds->hds[i]->name, name, namelen)) {
      return dynhds->hds[i];
    }
  }
  return NULL;
}